

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint getNumColorChannels(LodePNGColorType colortype)

{
  uint uVar1;
  
  uVar1 = 0;
  if (colortype < 7) {
    uVar1 = *(uint *)(&DAT_0024a348 + (ulong)colortype * 4);
  }
  return uVar1;
}

Assistant:

static unsigned getNumColorChannels(LodePNGColorType colortype)
{
  switch(colortype)
  {
    case 0: return 1; /*grey*/
    case 2: return 3; /*RGB*/
    case 3: return 1; /*palette*/
    case 4: return 2; /*grey + alpha*/
    case 6: return 4; /*RGBA*/
  }
  return 0; /*unexisting color type*/
}